

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLinking.cpp
# Opt level: O0

void __thiscall
glcts::GeometryShaderInvalidArrayedInputVariablesTest::initShaderObjects
          (GeometryShaderInvalidArrayedInputVariablesTest *this,GLenum gs_input_primitive_type,
          bool *out_has_fs_compiled_successfully,bool *out_has_gs_compiled_successfully,
          bool *out_has_vs_compiled_successfully)

{
  int iVar1;
  GLuint GVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  GLuint local_150;
  GLuint local_14c;
  undefined8 local_148;
  undefined8 local_140;
  bool *local_138;
  bool *local_130;
  undefined8 uStack_100;
  GLuint so_id;
  char *so_code;
  bool *out_compile_result;
  GLint compile_status;
  uint n_shader_type;
  char *specialized_vs_code_raw;
  string specialized_vs_code;
  char *specialized_gs_code_raw;
  string specialized_gs_code;
  char *gs_code_raw;
  undefined1 local_80 [8];
  string gs_code;
  char *specialized_fs_code_raw;
  string specialized_fs_code;
  Functions *gl;
  bool *out_has_vs_compiled_successfully_local;
  bool *out_has_gs_compiled_successfully_local;
  bool *out_has_fs_compiled_successfully_local;
  GLenum gs_input_primitive_type_local;
  GeometryShaderInvalidArrayedInputVariablesTest *this_local;
  
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar4->_vptr_RenderContext[3])();
  specialized_fs_code.field_2._8_8_ = CONCAT44(extraout_var,iVar1);
  TestCaseBase::specializeShader_abi_cxx11_
            ((string *)&specialized_fs_code_raw,&this->super_TestCaseBase,1,&dummy_fs_code);
  gs_code.field_2._8_8_ = std::__cxx11::string::c_str();
  getGSCode_abi_cxx11_((string *)local_80,this,gs_input_primitive_type);
  specialized_gs_code.field_2._8_8_ = std::__cxx11::string::c_str();
  TestCaseBase::specializeShader_abi_cxx11_
            ((string *)&specialized_gs_code_raw,&this->super_TestCaseBase,1,
             (char **)((long)&specialized_gs_code.field_2 + 8));
  specialized_vs_code.field_2._8_8_ = std::__cxx11::string::c_str();
  getSpecializedVSCode_abi_cxx11_((string *)&specialized_vs_code_raw,this);
  _compile_status = std::__cxx11::string::c_str();
  GVar2 = (**(code **)(specialized_fs_code.field_2._8_8_ + 0x3f0))(0x8b30);
  this->m_fs_id = GVar2;
  GVar2 = (**(code **)(specialized_fs_code.field_2._8_8_ + 0x3f0))(0x8dd9);
  this->m_gs_id = GVar2;
  GVar2 = (**(code **)(specialized_fs_code.field_2._8_8_ + 0x3f0))(0x8b31);
  this->m_vs_id = GVar2;
  dVar3 = (**(code **)(specialized_fs_code.field_2._8_8_ + 0x800))();
  glu::checkError(dVar3,"glCreateShader() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
                  ,0x2f1);
  for (out_compile_result._4_4_ = 0; out_compile_result._4_4_ < 3;
      out_compile_result._4_4_ = out_compile_result._4_4_ + 1) {
    out_compile_result._0_4_ = 0;
    local_130 = out_has_fs_compiled_successfully;
    if (out_compile_result._4_4_ != 0) {
      local_138 = out_has_vs_compiled_successfully;
      if (out_compile_result._4_4_ == 1) {
        local_138 = out_has_gs_compiled_successfully;
      }
      local_130 = local_138;
    }
    so_code = local_130;
    if (out_compile_result._4_4_ == 0) {
      local_140 = gs_code.field_2._8_8_;
    }
    else {
      if (out_compile_result._4_4_ == 1) {
        local_148 = specialized_vs_code.field_2._8_8_;
      }
      else {
        local_148 = _compile_status;
      }
      local_140 = local_148;
    }
    uStack_100 = local_140;
    if (out_compile_result._4_4_ == 0) {
      local_14c = this->m_fs_id;
    }
    else {
      if (out_compile_result._4_4_ == 1) {
        local_150 = this->m_gs_id;
      }
      else {
        local_150 = this->m_vs_id;
      }
      local_14c = local_150;
    }
    (**(code **)(specialized_fs_code.field_2._8_8_ + 0x12b8))
              (local_14c,1,&stack0xffffffffffffff00,0);
    dVar3 = (**(code **)(specialized_fs_code.field_2._8_8_ + 0x800))();
    glu::checkError(dVar3,"glShaderSource() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
                    ,0x304);
    (**(code **)(specialized_fs_code.field_2._8_8_ + 0x248))(local_14c);
    dVar3 = (**(code **)(specialized_fs_code.field_2._8_8_ + 0x800))();
    glu::checkError(dVar3,"glCompileShader() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
                    ,0x307);
    (**(code **)(specialized_fs_code.field_2._8_8_ + 0xa70))(local_14c,0x8b81,&out_compile_result);
    dVar3 = (**(code **)(specialized_fs_code.field_2._8_8_ + 0x800))();
    glu::checkError(dVar3,"glGetShaderiv() call failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderLinking.cpp"
                    ,0x30a);
    *so_code = (int)out_compile_result == 1;
  }
  std::__cxx11::string::~string((string *)&specialized_vs_code_raw);
  std::__cxx11::string::~string((string *)&specialized_gs_code_raw);
  std::__cxx11::string::~string((string *)local_80);
  std::__cxx11::string::~string((string *)&specialized_fs_code_raw);
  return;
}

Assistant:

void GeometryShaderInvalidArrayedInputVariablesTest::initShaderObjects(glw::GLenum gs_input_primitive_type,
																	   bool*	   out_has_fs_compiled_successfully,
																	   bool*	   out_has_gs_compiled_successfully,
																	   bool*	   out_has_vs_compiled_successfully)
{
	const glw::Functions& gl					  = m_context.getRenderContext().getFunctions();
	std::string			  specialized_fs_code	 = specializeShader(1, &dummy_fs_code);
	const char*			  specialized_fs_code_raw = specialized_fs_code.c_str();
	std::string			  gs_code				  = getGSCode(gs_input_primitive_type);
	const char*			  gs_code_raw			  = gs_code.c_str();
	std::string			  specialized_gs_code	 = specializeShader(1, &gs_code_raw);
	const char*			  specialized_gs_code_raw = specialized_gs_code.c_str();
	std::string			  specialized_vs_code	 = getSpecializedVSCode();
	const char*			  specialized_vs_code_raw = specialized_vs_code.c_str();

	m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_gs_id = gl.createShader(GL_GEOMETRY_SHADER);
	m_vs_id = gl.createShader(GL_VERTEX_SHADER);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call failed.");

	for (unsigned int n_shader_type = 0; n_shader_type < 3; /* fs, gs, vs */
		 n_shader_type++)
	{
		glw::GLint compile_status	 = GL_FALSE;
		bool*	  out_compile_result = (n_shader_type == 0) ? out_has_fs_compiled_successfully :
														  (n_shader_type == 1) ? out_has_gs_compiled_successfully :
																				 out_has_vs_compiled_successfully;

		const char* so_code = (n_shader_type == 0) ?
								  specialized_fs_code_raw :
								  (n_shader_type == 1) ? specialized_gs_code_raw : specialized_vs_code_raw;

		glw::GLuint so_id = (n_shader_type == 0) ? m_fs_id : (n_shader_type == 1) ? m_gs_id : m_vs_id;

		gl.shaderSource(so_id, 1,			/* count */
						&so_code, DE_NULL); /* length */

		GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call failed");

		gl.compileShader(so_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader() call failed");

		gl.getShaderiv(so_id, GL_COMPILE_STATUS, &compile_status);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() call failed");

		*out_compile_result = (compile_status == GL_TRUE);
	} /* for (both shader stages) */
}